

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
LabelState<false>::String
          (LabelState<false> *this,Context<false> *ctx,char *str,SizeType param_4,bool copy)

{
  undefined4 in_ECX;
  example *in_RDX;
  vw *in_RSI;
  undefined1 in_R8B;
  allocator local_41;
  string local_40 [32];
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar1;
  example *ec;
  
  uVar1 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  ec = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)in_RDX,&local_41);
  VW::parse_example_label(in_RSI,ec,(string *)CONCAT44(in_ECX,uVar1));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (BaseState<false> *)in_RSI->l;
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType /* len */, bool copy)
  {
    // only to be used with copy=false
    assert(!copy);

    VW::parse_example_label(*ctx.all, *ctx.ex, str);
    return ctx.previous_state;
  }